

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datatype.h
# Opt level: O1

void kException_Init(KonohaContext *kctx,kObject_conflict *o,void *conf)

{
  if (conf == (void *)0x0) {
    conf = kctx->share->emptyString;
  }
  (*(kctx->platApi->GCModule).UpdateObjectField)
            (o,(o->field_1).fieldObjectItems[2],(kObjectVar *)conf);
  (o->field_1).fieldObjectItems[2] = (kObject *)conf;
  (o->field_1).fieldObjectItems[0] = (kObject *)0x0;
  (o->field_1).fieldObjectItems[1] = (kObject *)0x0;
  (*(kctx->platApi->GCModule).UpdateObjectField)
            (o,(o->field_1).fieldObjectItems[3],(kObjectVar *)kctx->share->emptyArray);
  (o->field_1).fieldObjectItems[3] = (kObject *)kctx->share->emptyArray;
  return;
}

Assistant:

static void kException_Init(KonohaContext *kctx, kObject *o, void *conf)
{
	kExceptionVar *e = (kExceptionVar *)o;
	kString *msg = conf == NULL ? TS_EMPTY : (kString *)conf;
	KFieldInit(e, e->Message, msg);
	//DBG_ASSERT(IS_String(msg));
	e->uline  = 0;
	e->symbol = 0;
	e->fault  = 0;
	KFieldInit(e, e->StackTraceList, K_EMPTYARRAY);
}